

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderLimitsRenderingBase::initTest(GeometryShaderLimitsRenderingBase *this)

{
  bool bVar1;
  deUint32 dVar2;
  ContextType type;
  GLuint GVar3;
  NotSupportedError *pNVar4;
  RenderContext *pRVar5;
  GLfloat extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar6;
  TestError *pTVar7;
  MessageBuilder local_1d0;
  ApiType local_50;
  float local_4c;
  undefined1 local_48 [4];
  GLfloat required_point_size;
  GLfloat point_size_range [2];
  Functions *gl;
  GeometryShaderLimitsRenderingBase *this_local;
  
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar4,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
               ,0x409);
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (((this->super_TestCaseBase).m_is_gpu_shader5_supported & 1U) == 0) {
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar4,"GPU shader5 functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
               ,0x40f);
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  point_size_range[0] = (GLfloat)(*pRVar5->_vptr_RenderContext[3])();
  point_size_range[1] = extraout_var;
  memset(local_48,0,8);
  local_4c = 0.0;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  local_50.m_bits = (*pRVar5->_vptr_RenderContext[2])();
  bVar1 = glu::isContextTypeES((ContextType)local_50.m_bits);
  if (bVar1) {
    (**(code **)((long)point_size_range + 0x818))(0x846d,local_48);
  }
  else {
    (**(code **)((long)point_size_range + 0x818))(0xb12,local_48);
  }
  dVar2 = (**(code **)((long)point_size_range + 0x800))();
  glu::checkError(dVar2,"glGetFloatv() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x422);
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[8])(this,&local_4c);
  if (required_point_size < local_4c) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1d0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_1d0,(char (*) [48])"Test requires a minimum maximum point size of: ")
    ;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_4c);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [41])0x2afbcbe);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&required_point_size);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d0);
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar4,"Required point size is not supported","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
               ,0x42d);
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  type.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  bVar1 = glu::isContextTypeES(type);
  if (!bVar1) {
    (**(code **)((long)point_size_range + 0x5e0))(0x8642);
  }
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[9])
            (this,&this->m_fragment_shader_parts,&this->m_n_fragment_shader_parts,
             &this->m_geometry_shader_parts,&this->m_n_geometry_shader_parts,
             &this->m_vertex_shader_parts,&this->m_n_vertex_shader_parts);
  GVar3 = (**(code **)((long)point_size_range + 0x3c8))();
  this->m_program_object_id = GVar3;
  GVar3 = (**(code **)((long)point_size_range + 0x3f0))(0x8b30);
  this->m_fragment_shader_id = GVar3;
  GVar3 = (**(code **)((long)point_size_range + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  this->m_geometry_shader_id = GVar3;
  GVar3 = (**(code **)((long)point_size_range + 0x3f0))(0x8b31);
  this->m_vertex_shader_id = GVar3;
  dVar2 = (**(code **)((long)point_size_range + 0x800))();
  glu::checkError(dVar2,"Failed to create program or shader object(s)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x43f);
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_program_object_id,this->m_fragment_shader_id,
                     this->m_n_fragment_shader_parts,this->m_fragment_shader_parts,
                     this->m_geometry_shader_id,this->m_n_geometry_shader_parts,
                     this->m_geometry_shader_parts,this->m_vertex_shader_id,
                     this->m_n_vertex_shader_parts,this->m_vertex_shader_parts,(bool *)0x0);
  if (!bVar1) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Could not create program from valid vertex/geometry/fragment shader",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
               ,0x447);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)((long)point_size_range + 0x708))(1,&this->m_vertex_array_object_id);
  (**(code **)((long)point_size_range + 0xd8))(this->m_vertex_array_object_id);
  dVar2 = (**(code **)((long)point_size_range + 0x800))();
  glu::checkError(dVar2,"Could not create vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x44e);
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[7])
            (this,&this->m_texture_format,&this->m_texture_read_format,&this->m_texture_read_type,
             &this->m_texture_width,&this->m_texture_height,&this->m_texture_pixel_size);
  (**(code **)((long)point_size_range + 0x6f8))(1,&this->m_color_texture_id);
  (**(code **)((long)point_size_range + 0x6d0))(1,&this->m_framebuffer_object_id);
  dVar2 = (**(code **)((long)point_size_range + 0x800))();
  glu::checkError(dVar2,"Could not create framebuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x458);
  bVar1 = TestCaseBase::setupFramebufferWithTextureAsAttachment
                    (&this->super_TestCaseBase,this->m_framebuffer_object_id,
                     this->m_color_texture_id,this->m_texture_format,this->m_texture_width,
                     this->m_texture_height);
  if (!bVar1) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Failed to setup framebuffer",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
               ,0x45d);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void GeometryShaderLimitsRenderingBase::initTest()
{
	/* This test should only run if EXT_geometry_shader is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Query on support of EXT_gpu_shader5 */
	if (!m_is_gpu_shader5_supported)
	{
		throw tcu::NotSupportedError(GPU_SHADER5_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Verify that point size range is supported */
	glw::GLfloat point_size_range[2] = { 0 };
	glw::GLfloat required_point_size = 0.0f;

	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		gl.getFloatv(GL_POINT_SIZE_RANGE, point_size_range);
	}
	else
	{
		gl.getFloatv(GL_ALIASED_POINT_SIZE_RANGE, point_size_range);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv() call failed");

	getRequiredPointSize(required_point_size);

	if (required_point_size > point_size_range[1])
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Test requires a minimum maximum point size of: " << required_point_size
						   << ", implementation reports a maximum of : " << point_size_range[1]
						   << tcu::TestLog::EndMessage;

		throw tcu::NotSupportedError("Required point size is not supported", "", __FILE__, __LINE__);
	}
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		gl.enable(GL_PROGRAM_POINT_SIZE);
	}

	/* Get shaders code from child class */
	getShaderParts(m_fragment_shader_parts, m_n_fragment_shader_parts, m_geometry_shader_parts,
				   m_n_geometry_shader_parts, m_vertex_shader_parts, m_n_vertex_shader_parts);

	/* Create program and shaders */
	m_program_object_id = gl.createProgram();

	m_fragment_shader_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_geometry_shader_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_vertex_shader_id   = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create program or shader object(s)");

	/* Build program */
	if (false == buildProgram(m_program_object_id, m_fragment_shader_id, m_n_fragment_shader_parts,
							  m_fragment_shader_parts, m_geometry_shader_id, m_n_geometry_shader_parts,
							  m_geometry_shader_parts, m_vertex_shader_id, m_n_vertex_shader_parts,
							  m_vertex_shader_parts))
	{
		TCU_FAIL("Could not create program from valid vertex/geometry/fragment shader");
	}

	/* Set up a vertex array object */
	gl.genVertexArrays(1, &m_vertex_array_object_id);
	gl.bindVertexArray(m_vertex_array_object_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create vertex array object");

	/* Get framebuffer details */
	getFramebufferDetails(m_texture_format, m_texture_read_format, m_texture_read_type, m_texture_width,
						  m_texture_height, m_texture_pixel_size);

	/* Set up texture object and a FBO */
	gl.genTextures(1, &m_color_texture_id);
	gl.genFramebuffers(1, &m_framebuffer_object_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create framebuffer");

	if (false == setupFramebufferWithTextureAsAttachment(m_framebuffer_object_id, m_color_texture_id, m_texture_format,
														 m_texture_width, m_texture_height))
	{
		TCU_FAIL("Failed to setup framebuffer");
	}
}